

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_hex
          (int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  undefined1 uVar1;
  uint uVar2;
  undefined1 n [16];
  string_view prefix;
  format_specs specs;
  int iVar3;
  long in_RDI;
  string_view f;
  undefined1 in_stack_00000000 [20];
  int num_digits;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined1 local_60 [28];
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  internal *this_00;
  size_t sVar4;
  undefined4 in_stack_fffffffffffffff0;
  long lVar5;
  
  if (*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') {
    uVar2 = *(uint *)(in_RDI + 0x24);
    *(uint *)(in_RDI + 0x24) = uVar2 + 1;
    *(undefined1 *)(in_RDI + 0x20 + (ulong)uVar2) = 0x30;
    uVar1 = *(undefined1 *)(*(long *)(in_RDI + 8) + 8);
    uVar2 = *(uint *)(in_RDI + 0x24);
    *(uint *)(in_RDI + 0x24) = uVar2 + 1;
    *(undefined1 *)(in_RDI + 0x20 + (ulong)uVar2) = uVar1;
  }
  this_00 = *(internal **)(in_RDI + 0x10);
  sVar4 = *(size_t *)(in_RDI + 0x18);
  n._8_8_ = in_stack_ffffffffffffff50;
  n._0_8_ = in_stack_ffffffffffffff48;
  lVar5 = in_RDI;
  iVar3 = count_digits<4u,unsigned__int128>(this_00,(unsigned___int128)n);
  f = get_prefix((int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *)0x233d4f);
  memcpy(local_60,*(void **)(in_RDI + 8),0x24);
  prefix.size_ = sVar4;
  prefix.data_ = (char *)this_00;
  specs.precision = iVar3;
  specs.width = in_stack_fffffffffffffff0;
  specs.type = (char)lVar5;
  specs._9_3_ = (int3)((ulong)lVar5 >> 8);
  specs.fill.data_[0] = (int)((ulong)lVar5 >> 0x20);
  specs.fill.data_._4_20_ = in_stack_00000000;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::hex_writer>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc
             ,prefix,specs,(hex_writer)f);
  return;
}

Assistant:

void on_hex() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = specs.type;
      }
      int num_digits = count_digits<4>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       hex_writer{*this, num_digits});
    }